

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264e_slice.c
# Opt level: O0

RK_S32 h264e_slice_write(H264eSlice *slice,void *p,RK_U32 size)

{
  int iVar1;
  char local_178 [8];
  char log [256];
  int local_6c;
  RK_S32 pos;
  RK_U8 *tmp;
  RK_S32 i;
  RK_S32 bitCnt;
  MppWriteCtx *s;
  MppWriteCtx stream;
  RK_U32 size_local;
  void *p_local;
  H264eSlice *slice_local;
  
  stream._44_4_ = size;
  mpp_writer_init((MppWriteCtx *)&s,p,size);
  h264e_slice_write_header(slice,(MppWriteCtx *)&s);
  tmp._4_4_ = stream.byte_cnt + stream.stream._4_4_ * 8;
  if ((h264e_debug & 0x40) != 0) {
    local_6c = sprintf(local_178,"sw stream: ");
    for (tmp._0_4_ = 0; (int)tmp < 0x10; tmp._0_4_ = (int)tmp + 1) {
      iVar1 = sprintf(local_178 + local_6c,"%02x ",(ulong)*(byte *)((long)p + (long)(int)tmp));
      local_6c = iVar1 + local_6c;
    }
    sprintf(local_178 + local_6c,"\n");
    if ((h264e_debug & 0x40) != 0) {
      _mpp_log_l(4,"h264e_slice",local_178,"h264e_slice_write");
    }
  }
  return tmp._4_4_;
}

Assistant:

RK_S32 h264e_slice_write(H264eSlice *slice, void *p, RK_U32 size)
{
    MppWriteCtx stream;
    MppWriteCtx *s = &stream;
    RK_S32 bitCnt = 0;

    mpp_writer_init(s, p, size);

    h264e_slice_write_header(slice, s);

    bitCnt = s->buffered_bits + s->byte_cnt * 8;

    // update on cabac mode
    if (slice->entropy_coding_mode)
        bitCnt = s->buffered_bits + s->byte_cnt * 8;

    if (h264e_debug & H264E_DBG_SLICE) {
        RK_S32 i;
        RK_U8 *tmp = p;
        RK_S32 pos = 0;
        char log[256];

        pos = sprintf(log + pos, "sw stream: ");
        for (i = 0; i < 16; i ++) {
            pos += sprintf(log + pos, "%02x ", tmp[i]);
        }
        pos += sprintf(log + pos, "\n");
        h264e_dbg_slice(log);
    }

    return bitCnt;
}